

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyAssignedOnReset.cpp
# Opt level: O1

string * __thiscall
OnlyAssignedOnReset::description_abi_cxx11_
          (string *__return_storage_ptr__,OnlyAssignedOnReset *this)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string_view<char> fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined1 local_288 [28];
  text_style local_26c;
  buffer<char> local_258;
  char local_238 [544];
  
  local_26c.foreground_color.is_rgb = false;
  local_26c.foreground_color.value.term_color = '\0';
  local_26c.background_color.is_rgb = false;
  local_26c.background_color.value.term_color = '\0';
  local_26c.set_foreground_color = false;
  local_26c.set_background_color = false;
  local_26c.ems = italic;
  local_258.size_ = 0;
  local_258.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_258.capacity_ = 500;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_288;
  fmt.size_ = 0x10d;
  fmt.data_ = 
  "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk or negedge reset) begin\n        if (~reset) begin\n            r <= 1\'b0;\n        end\n        begin\n            ~~r do not have a value when design is not in reset\n        end\n    end\nendmodule\n"
  ;
  local_258.ptr_ = local_238;
  ::fmt::v11::detail::vformat_to<char>
            (&local_258,&local_26c,fmt,(basic_format_args<fmt::v11::context>)(auVar2 << 0x40));
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_258.ptr_,local_258.ptr_ + local_258.size_);
  if (local_258.ptr_ != local_238) {
    free(local_258.ptr_);
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_2a8,0,0,
                      "A register in an always_ff only have value while the design is on reset.\n\n"
                      ,0x4a);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar5) {
    uVar3 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff only have value while the design is on reset.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "        if (~reset) begin\n"
                           "            r <= 1'b0;\n"
                           "        end\n"
                           "        begin\n"
                           "            ~~r do not have a value when design is not in reset\n"
                           "        end\n"
                           "    end\n"
                           "endmodule\n");
    }